

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

int main(void)

{
  int iVar1;
  nn_trie trie;
  nn_trie local_10;
  
  local_10.root = (nn_trie_node *)0x0;
  iVar1 = nn_trie_match(&local_10,"",0);
  if (iVar1 == 0) {
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 != 0) goto LAB_00103a45;
    nn_node_term((nn_trie_node *)0x0);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,"",0);
    if (iVar1 == 0) goto LAB_00103a4a;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 == 0) goto LAB_00103a4f;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_00103a54;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_00103a59;
    iVar1 = nn_trie_match(&local_10,"DEF",3);
    if (iVar1 != 0) goto LAB_00103a5e;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AB",2);
    if (iVar1 != 0) goto LAB_00103a63;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_00103a68;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCDE",5);
    if (iVar1 == 0) goto LAB_00103a6d;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"01234567890123456789012345678901234",0x23);
    if (iVar1 == 0) goto LAB_00103a72;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 != 0) goto LAB_00103a77;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"012456789",10);
    if (iVar1 != 0) goto LAB_00103a7c;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"012345678901234567",0x12);
    if (iVar1 != 0) goto LAB_00103a81;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"01234567890123456789012345678901234",0x23);
    if (iVar1 == 0) goto LAB_00103a86;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABC",3);
    if (iVar1 == 0) goto LAB_00103a8b;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ADE",3);
    if (iVar1 == 0) goto LAB_00103a90;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 != 0) goto LAB_00103a95;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AD",2);
    if (iVar1 != 0) goto LAB_00103a9a;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103a9f;
    iVar1 = nn_trie_subscribe(&local_10,"B",1);
    if (iVar1 == 0) goto LAB_00103aa4;
    iVar1 = nn_trie_subscribe(&local_10,"C",1);
    if (iVar1 == 0) goto LAB_00103aa9;
    iVar1 = nn_trie_subscribe(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_00103aae;
    iVar1 = nn_trie_subscribe(&local_10,"E",1);
    if (iVar1 == 0) goto LAB_00103ab3;
    iVar1 = nn_trie_subscribe(&local_10,"F",1);
    if (iVar1 == 0) goto LAB_00103ab8;
    iVar1 = nn_trie_subscribe(&local_10,"1",1);
    if (iVar1 == 0) goto LAB_00103abd;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"@",1);
    if (iVar1 == 0) goto LAB_00103ac2;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"b",1);
    if (iVar1 == 0) goto LAB_00103ac7;
    iVar1 = nn_trie_subscribe(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_00103acc;
    iVar1 = nn_trie_match(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_00103ad1;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103ad6;
    iVar1 = nn_trie_match(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_00103adb;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"000",3);
    if (iVar1 == 0) goto LAB_00103ae0;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"a",1);
    if (iVar1 != 0) goto LAB_00103ae5;
    iVar1 = nn_trie_match(&local_10,"c",1);
    if (iVar1 != 0) goto LAB_00103aea;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABCD",4);
    if (iVar1 == 0) goto LAB_00103aef;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"AB",2);
    if (iVar1 == 0) goto LAB_00103af4;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"AB",2);
    if (iVar1 != 1) goto LAB_00103af9;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"AB",2);
    if (iVar1 != 0) goto LAB_00103afe;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCDEF",6);
    if (iVar1 == 0) goto LAB_00103b03;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"ABEF",4);
    if (iVar1 == 0) goto LAB_00103b08;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"ABCD",4);
    if (iVar1 != 1) goto LAB_00103b0d;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABCD",4);
    if (iVar1 != 0) goto LAB_00103b12;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"ABEF",4);
    if (iVar1 == 0) goto LAB_00103b17;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103b1c;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"A",1);
    if (iVar1 != 1) goto LAB_00103b21;
    iVar1 = nn_trie_match(&local_10,"",0);
    if (iVar1 != 0) goto LAB_00103b26;
    iVar1 = nn_trie_match(&local_10,(uint8_t *)"A",1);
    if (iVar1 != 0) goto LAB_00103b2b;
    nn_node_term(local_10.root);
    local_10.root = (nn_trie_node *)0x0;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"A",1);
    if (iVar1 == 0) goto LAB_00103b30;
    iVar1 = nn_trie_subscribe(&local_10,"B",1);
    if (iVar1 == 0) goto LAB_00103b35;
    iVar1 = nn_trie_subscribe(&local_10,"C",1);
    if (iVar1 == 0) goto LAB_00103b3a;
    iVar1 = nn_trie_subscribe(&local_10,"0",1);
    if (iVar1 == 0) goto LAB_00103b3f;
    iVar1 = nn_trie_subscribe(&local_10,"E",1);
    if (iVar1 == 0) goto LAB_00103b44;
    iVar1 = nn_trie_subscribe(&local_10,"F",1);
    if (iVar1 == 0) goto LAB_00103b49;
    iVar1 = nn_trie_subscribe(&local_10,"1",1);
    if (iVar1 == 0) goto LAB_00103b4e;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"@",1);
    if (iVar1 == 0) goto LAB_00103b53;
    iVar1 = nn_trie_subscribe(&local_10,(uint8_t *)"b",1);
    if (iVar1 == 0) goto LAB_00103b58;
    iVar1 = nn_trie_subscribe(&local_10,"f",1);
    if (iVar1 == 0) goto LAB_00103b5d;
    iVar1 = nn_node_unsubscribe(&local_10.root,"0",1);
    if (iVar1 != 1) goto LAB_00103b62;
    iVar1 = nn_node_unsubscribe(&local_10.root,"f",1);
    if (iVar1 != 1) goto LAB_00103b67;
    iVar1 = nn_node_unsubscribe(&local_10.root,"E",1);
    if (iVar1 != 1) goto LAB_00103b6c;
    iVar1 = nn_node_unsubscribe(&local_10.root,"B",1);
    if (iVar1 != 1) goto LAB_00103b71;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"A",1);
    if (iVar1 != 1) goto LAB_00103b76;
    iVar1 = nn_node_unsubscribe(&local_10.root,"1",1);
    if (iVar1 != 1) goto LAB_00103b7b;
    iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"@",1);
    if (iVar1 != 1) goto LAB_00103b80;
    iVar1 = nn_node_unsubscribe(&local_10.root,"F",1);
    if (iVar1 != 1) goto LAB_00103b85;
    iVar1 = nn_node_unsubscribe(&local_10.root,"C",1);
    if (iVar1 == 1) {
      iVar1 = nn_node_unsubscribe(&local_10.root,(uint8_t *)"b",1);
      if (iVar1 == 1) {
        nn_node_term(local_10.root);
        return 0;
      }
      goto LAB_00103b8f;
    }
  }
  else {
    main_cold_1();
LAB_00103a45:
    main_cold_2();
LAB_00103a4a:
    main_cold_68();
LAB_00103a4f:
    main_cold_67();
LAB_00103a54:
    main_cold_66();
LAB_00103a59:
    main_cold_65();
LAB_00103a5e:
    main_cold_3();
LAB_00103a63:
    main_cold_4();
LAB_00103a68:
    main_cold_64();
LAB_00103a6d:
    main_cold_63();
LAB_00103a72:
    main_cold_62();
LAB_00103a77:
    main_cold_5();
LAB_00103a7c:
    main_cold_6();
LAB_00103a81:
    main_cold_7();
LAB_00103a86:
    main_cold_61();
LAB_00103a8b:
    main_cold_60();
LAB_00103a90:
    main_cold_59();
LAB_00103a95:
    main_cold_8();
LAB_00103a9a:
    main_cold_9();
LAB_00103a9f:
    main_cold_58();
LAB_00103aa4:
    main_cold_57();
LAB_00103aa9:
    main_cold_56();
LAB_00103aae:
    main_cold_55();
LAB_00103ab3:
    main_cold_54();
LAB_00103ab8:
    main_cold_53();
LAB_00103abd:
    main_cold_52();
LAB_00103ac2:
    main_cold_51();
LAB_00103ac7:
    main_cold_50();
LAB_00103acc:
    main_cold_49();
LAB_00103ad1:
    main_cold_48();
LAB_00103ad6:
    main_cold_47();
LAB_00103adb:
    main_cold_46();
LAB_00103ae0:
    main_cold_45();
LAB_00103ae5:
    main_cold_10();
LAB_00103aea:
    main_cold_11();
LAB_00103aef:
    main_cold_44();
LAB_00103af4:
    main_cold_43();
LAB_00103af9:
    main_cold_12();
LAB_00103afe:
    main_cold_13();
LAB_00103b03:
    main_cold_42();
LAB_00103b08:
    main_cold_41();
LAB_00103b0d:
    main_cold_14();
LAB_00103b12:
    main_cold_15();
LAB_00103b17:
    main_cold_40();
LAB_00103b1c:
    main_cold_39();
LAB_00103b21:
    main_cold_16();
LAB_00103b26:
    main_cold_17();
LAB_00103b2b:
    main_cold_18();
LAB_00103b30:
    main_cold_38();
LAB_00103b35:
    main_cold_37();
LAB_00103b3a:
    main_cold_36();
LAB_00103b3f:
    main_cold_35();
LAB_00103b44:
    main_cold_34();
LAB_00103b49:
    main_cold_33();
LAB_00103b4e:
    main_cold_32();
LAB_00103b53:
    main_cold_31();
LAB_00103b58:
    main_cold_30();
LAB_00103b5d:
    main_cold_29();
LAB_00103b62:
    main_cold_19();
LAB_00103b67:
    main_cold_20();
LAB_00103b6c:
    main_cold_21();
LAB_00103b71:
    main_cold_22();
LAB_00103b76:
    main_cold_23();
LAB_00103b7b:
    main_cold_24();
LAB_00103b80:
    main_cold_25();
LAB_00103b85:
    main_cold_26();
  }
  main_cold_27();
LAB_00103b8f:
  main_cold_28();
}

Assistant:

int main ()
{
    int rc;
    struct nn_trie trie;

    /*  Try matching with an empty trie. */
    nn_trie_init (&trie);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with "all" subscription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try some simple matching. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "DEF", 3);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDE", 5);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try a long subcsription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012456789", 10);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012345678901234567", 18);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try matching with a sparse node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ADE", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AD", 2);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with a dense node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "000", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "a", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "c", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Check prefix splitting and compaction. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDEF", 6);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Check whether there's no problem with removing all subscriptions. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);  

    /*  Check converting from sparse node to dense node and vice versa. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    return 0;
}